

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall Am_Object::Destroy(Am_Object *this)

{
  uint *puVar1;
  Am_Object_Data *pAVar2;
  Am_Object_Data *in_RAX;
  Am_Object_Data *pAVar3;
  Am_Object local_28;
  
  if (this->data != (Am_Object_Data *)0x0) {
    local_28.data = in_RAX;
    if ((this->data->owner_slot).super_Am_Value.value.wrapper_value != (Am_Wrapper *)0x0) {
      Remove_From_Owner(this);
    }
    pAVar2 = this->data;
    if ((pAVar2->super_Am_Wrapper).refs != 1) {
      for (pAVar3 = pAVar2->first_instance; pAVar3 != (Am_Object_Data *)0x0;
          pAVar3 = pAVar3->next_instance) {
        puVar1 = &(pAVar3->super_Am_Wrapper).refs;
        *puVar1 = *puVar1 + 1;
      }
      pAVar3 = pAVar2->first_instance;
      pAVar2->first_instance = (Am_Object_Data *)0x0;
      while (pAVar2 = pAVar3, pAVar2 != (Am_Object_Data *)0x0) {
        pAVar3 = pAVar2->next_instance;
        puVar1 = &(pAVar2->super_Am_Wrapper).refs;
        *puVar1 = *puVar1 + 1;
        local_28.data = pAVar2;
        Destroy(&local_28);
        ~Am_Object(&local_28);
        puVar1 = &(pAVar2->super_Am_Wrapper).refs;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          (*(pAVar2->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(pAVar2)
          ;
        }
      }
      if ((this->data->data).data != (char *)0x0) {
        Am_Object_Data::destroy_object(this->data);
      }
    }
    pAVar2 = this->data;
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pAVar2->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])();
    }
    this->data = (Am_Object_Data *)0x0;
  }
  return;
}

Assistant:

void
Am_Object::Destroy()
{
#ifdef DEBUG
  Global_Call_Object_Trace(*this, Am_No_Object, Am_TRACE_OBJECT_DESTROYED);
#endif

  if (!data)
    return;

  if (data->owner_slot.value.wrapper_value)
    Remove_From_Owner();

  if (!data->Is_Unique()) {
    Am_Object_Data *current;
    Am_Object_Data *next;

    for (current = data->first_instance; current != nullptr;
         current = current->next_instance)
      current->Note_Reference(); // 1

    current = data->first_instance;
    data->first_instance = nullptr;
    for (; current != nullptr; current = next) {
      next = current->next_instance;
      current->Note_Reference();    // 2
      Am_Object(current).Destroy(); // 2
      current->Release();           // 1
    }

    if (data->data.data)
      data->destroy_object();
  }

  data->Release();
  data = nullptr;
}